

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::OnImportTable
          (BinaryReaderObjdump *this,Index import_index,string_view module_name,
          string_view field_name,Index table_index,Type elem_type,Limits *elem_limits)

{
  char *pcVar1;
  size_type sVar2;
  const_pointer pcVar3;
  size_type sVar4;
  const_pointer pcVar5;
  Index import_index_local;
  BinaryReaderObjdump *this_local;
  undefined1 auStack_30 [4];
  Type elem_type_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local.data_ = (char *)field_name.size_;
  _auStack_30 = field_name.data_;
  module_name_local.data_ = (char *)module_name.size_;
  field_name_local.size_ = (size_type)module_name.data_;
  this_local._4_4_ = elem_type.enum_;
  pcVar1 = Type::GetName((Type *)((long)&this_local + 4));
  PrintDetails(this," - table[%u] type=%s initial=%ld",(ulong)table_index,pcVar1,
               elem_limits->initial);
  if ((elem_limits->has_max & 1U) != 0) {
    PrintDetails(this," max=%ld",elem_limits->max);
  }
  sVar2 = string_view::length((string_view *)&field_name_local.size_);
  pcVar3 = string_view::data((string_view *)&field_name_local.size_);
  sVar4 = string_view::length((string_view *)auStack_30);
  pcVar5 = string_view::data((string_view *)auStack_30);
  PrintDetails(this," <- %.*s.%.*s\n",sVar2 & 0xffffffff,pcVar3,sVar4 & 0xffffffff,pcVar5);
  Result::Result((Result *)((long)&module_name_local.size_ + 4),Ok);
  return (Result)module_name_local.size_._4_4_;
}

Assistant:

Result BinaryReaderObjdump::OnImportTable(Index import_index,
                                          string_view module_name,
                                          string_view field_name,
                                          Index table_index,
                                          Type elem_type,
                                          const Limits* elem_limits) {
  PrintDetails(" - table[%" PRIindex "] type=%s initial=%" PRId64, table_index,
               elem_type.GetName(), elem_limits->initial);
  if (elem_limits->has_max) {
    PrintDetails(" max=%" PRId64, elem_limits->max);
  }
  PrintDetails(" <- " PRIstringview "." PRIstringview "\n",
               WABT_PRINTF_STRING_VIEW_ARG(module_name),
               WABT_PRINTF_STRING_VIEW_ARG(field_name));
  return Result::Ok;
}